

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O0

void glcts::TextureCubeMapArraySamplingTest::getAttributes
               (samplerType sampler_type,attributeDefinition **out_attribute_definitions,
               GLuint *out_n_attributes)

{
  GLuint *out_n_attributes_local;
  attributeDefinition **out_attribute_definitions_local;
  samplerType sampler_type_local;
  
  if (sampler_type == Depth) {
    *out_attribute_definitions = getAttributes::depth_attributes;
    *out_n_attributes = 1;
  }
  else {
    *out_attribute_definitions = (attributeDefinition *)0x0;
    *out_n_attributes = 0;
  }
  return;
}

Assistant:

void TextureCubeMapArraySamplingTest::getAttributes(samplerType					sampler_type,
													const attributeDefinition*& out_attribute_definitions,
													glw::GLuint&				out_n_attributes)
{
	static attributeDefinition depth_attributes[] = { { attribute_refZ, type_float, RefZ, 1 } };

	static const glw::GLuint n_depth_attributes = sizeof(depth_attributes) / sizeof(depth_attributes[0]);

	switch (sampler_type)
	{
	case Depth:
		out_attribute_definitions = depth_attributes;
		out_n_attributes		  = n_depth_attributes;
		break;
	default:
		out_attribute_definitions = 0;
		out_n_attributes		  = 0;
		break;
	};
}